

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  uint64_t uVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"testsuites","");
  XmlWriter::startElement(&this->xml,&local_38,Newline|Indent);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  uVar1 = std::chrono::_V2::system_clock::now();
  (this->suiteTimer).m_nanoseconds = uVar1;
  (this->stdOutForSuite)._M_string_length = 0;
  *(this->stdOutForSuite)._M_dataplus._M_p = '\0';
  (this->stdErrForSuite)._M_string_length = 0;
  *(this->stdErrForSuite)._M_dataplus._M_p = '\0';
  this->unexpectedExceptions = 0;
  return;
}

Assistant:

void JunitReporter::testRunStarting( TestRunInfo const& runInfo )  {
        CumulativeReporterBase::testRunStarting( runInfo );
        xml.startElement( "testsuites" );
        suiteTimer.start();
        stdOutForSuite.clear();
        stdErrForSuite.clear();
        unexpectedExceptions = 0;
    }